

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Operation.cpp
# Opt level: O3

double __thiscall chrono::ChFunction_Operation::Get_y(ChFunction_Operation *this,double x)

{
  element_type *peVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar5 [16];
  double dVar4;
  undefined1 in_register_00001208 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  auVar6._8_56_ = in_register_00001208;
  auVar6._0_8_ = x;
  auVar3 = auVar6._0_16_;
  switch(this->op_type) {
  case ChOP_ADD:
    dVar4 = x;
    (*((this->fa).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ChFunction[4])();
    (*((this->fb).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ChFunction[4])();
    dVar4 = x + dVar4;
    break;
  case ChOP_SUB:
    dVar4 = x;
    (*((this->fa).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ChFunction[4])();
    (*((this->fb).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ChFunction[4])();
    dVar4 = dVar4 - x;
    break;
  case ChOP_MUL:
    dVar4 = x;
    (*((this->fa).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ChFunction[4])();
    (*((this->fb).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ChFunction[4])();
    dVar4 = x * dVar4;
    break;
  case ChOP_DIV:
    dVar4 = x;
    (*((this->fa).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ChFunction[4])();
    (*((this->fb).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ChFunction[4])();
    dVar4 = dVar4 / x;
    break;
  case ChOP_POW:
    dVar4 = x;
    (*((this->fa).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ChFunction[4])();
    (*((this->fb).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ChFunction[4])();
    dVar4 = pow(dVar4,x);
    return dVar4;
  case ChOP_MAX:
    dVar4 = x;
    (*((this->fa).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ChFunction[4])();
    auVar5._8_8_ = 0;
    auVar5._0_8_ = x;
    (*((this->fb).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ChFunction[4])();
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar4;
    auVar3 = vmaxsd_avx(auVar7,auVar5);
    dVar4 = auVar3._0_8_;
    break;
  case ChOP_MIN:
    dVar4 = x;
    (*((this->fa).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ChFunction[4])();
    auVar3._8_8_ = 0;
    auVar3._0_8_ = x;
    (*((this->fb).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ChFunction[4])();
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar4;
    auVar3 = vminsd_avx(auVar8,auVar3);
    dVar4 = auVar3._0_8_;
    break;
  case ChOP_MODULO:
    dVar4 = x;
    (*((this->fa).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ChFunction[4])();
    (*((this->fb).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ChFunction[4])();
    dVar4 = fmod(dVar4,x);
    return dVar4;
  case ChOP_FABS:
    (*((this->fa).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ChFunction[4])();
    auVar2._8_8_ = 0x7fffffffffffffff;
    auVar2._0_8_ = 0x7fffffffffffffff;
    auVar3 = vandpd_avx512vl(auVar3,auVar2);
    dVar4 = auVar3._0_8_;
    break;
  case ChOP_FUNCT:
    peVar1 = (this->fa).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*((this->fb).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ChFunction[4])();
    (*peVar1->_vptr_ChFunction[4])(peVar1);
    return x;
  default:
    dVar4 = 0.0;
  }
  return dVar4;
}

Assistant:

double ChFunction_Operation::Get_y(double x) const {
    double res;

    switch (op_type) {
        case ChOP_ADD:
            res = fa->Get_y(x) + fb->Get_y(x);
            break;
        case ChOP_SUB:
            res = fa->Get_y(x) - fb->Get_y(x);
            break;
        case ChOP_MUL:
            res = fa->Get_y(x) * fb->Get_y(x);
            break;
        case ChOP_DIV:
            res = fa->Get_y(x) / fb->Get_y(x);
            break;
        case ChOP_POW:
            res = pow(fa->Get_y(x), fb->Get_y(x));
            break;
        case ChOP_MAX:
            res = ChMax(fa->Get_y(x), fb->Get_y(x));
            break;
        case ChOP_MIN:
            res = ChMin(fa->Get_y(x), fb->Get_y(x));
            break;
        case ChOP_MODULO:
            res = fmod(fa->Get_y(x), fb->Get_y(x));
            break;
        case ChOP_FABS:
            res = fabs(fa->Get_y(x));
            break;
        case ChOP_FUNCT:
            res = fa->Get_y(fb->Get_y(x));
            break;
        default:
            res = 0;
            break;
    }
    return res;
}